

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.cpp
# Opt level: O0

void __thiscall
lunasvg::Canvas::strokePath(Canvas *this,Path *path,StrokeData *strokeData,Transform *transform)

{
  plutovg_canvas_t *ppVar1;
  LineCap LVar2;
  LineJoin LVar3;
  plutovg_matrix_t *matrix;
  DashArray *pDVar4;
  float *dashes;
  size_type sVar5;
  plutovg_path_t *path_00;
  float fVar6;
  Transform *transform_local;
  StrokeData *strokeData_local;
  Path *path_local;
  Canvas *this_local;
  
  plutovg_canvas_reset_matrix(this->m_canvas);
  plutovg_canvas_translate(this->m_canvas,(float)-this->m_x,(float)-this->m_y);
  ppVar1 = this->m_canvas;
  matrix = Transform::matrix(transform);
  plutovg_canvas_transform(ppVar1,matrix);
  ppVar1 = this->m_canvas;
  fVar6 = StrokeData::lineWidth(strokeData);
  plutovg_canvas_set_line_width(ppVar1,fVar6);
  ppVar1 = this->m_canvas;
  fVar6 = StrokeData::miterLimit(strokeData);
  plutovg_canvas_set_miter_limit(ppVar1,fVar6);
  ppVar1 = this->m_canvas;
  LVar2 = StrokeData::lineCap(strokeData);
  plutovg_canvas_set_line_cap(ppVar1,(uint)LVar2);
  ppVar1 = this->m_canvas;
  LVar3 = StrokeData::lineJoin(strokeData);
  plutovg_canvas_set_line_join(ppVar1,(uint)LVar3);
  ppVar1 = this->m_canvas;
  fVar6 = StrokeData::dashOffset(strokeData);
  plutovg_canvas_set_dash_offset(ppVar1,fVar6);
  ppVar1 = this->m_canvas;
  pDVar4 = StrokeData::dashArray(strokeData);
  dashes = std::vector<float,_std::allocator<float>_>::data(pDVar4);
  pDVar4 = StrokeData::dashArray(strokeData);
  sVar5 = std::vector<float,_std::allocator<float>_>::size(pDVar4);
  plutovg_canvas_set_dash_array(ppVar1,dashes,(int)sVar5);
  plutovg_canvas_set_operator(this->m_canvas,PLUTOVG_OPERATOR_SRC_OVER);
  ppVar1 = this->m_canvas;
  path_00 = Path::data(path);
  plutovg_canvas_stroke_path(ppVar1,path_00);
  return;
}

Assistant:

void Canvas::strokePath(const Path& path, const StrokeData& strokeData, const Transform& transform)
{
    plutovg_canvas_reset_matrix(m_canvas);
    plutovg_canvas_translate(m_canvas, -m_x, -m_y);
    plutovg_canvas_transform(m_canvas, &transform.matrix());
    plutovg_canvas_set_line_width(m_canvas, strokeData.lineWidth());
    plutovg_canvas_set_miter_limit(m_canvas, strokeData.miterLimit());
    plutovg_canvas_set_line_cap(m_canvas, static_cast<plutovg_line_cap_t>(strokeData.lineCap()));
    plutovg_canvas_set_line_join(m_canvas, static_cast<plutovg_line_join_t>(strokeData.lineJoin()));
    plutovg_canvas_set_dash_offset(m_canvas, strokeData.dashOffset());
    plutovg_canvas_set_dash_array(m_canvas, strokeData.dashArray().data(), strokeData.dashArray().size());
    plutovg_canvas_set_operator(m_canvas, PLUTOVG_OPERATOR_SRC_OVER);
    plutovg_canvas_stroke_path(m_canvas, path.data());
}